

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c++
# Opt level: O0

void kj::_::throwRemovedWrongList(void)

{
  char (*in_RCX) [77];
  String local_1b0;
  Exception local_198;
  
  Debug::makeDescription<char_const(&)[77]>
            (&local_1b0,
             (Debug *)
             "\"tried to remove element from kj::List but the element is in a different list\"",
             "tried to remove element from kj::List but the element is in a different list",in_RCX);
  Exception::Exception
            (&local_198,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list.c++"
             ,0x26,&local_1b0);
  throwFatalException(&local_198,0);
}

Assistant:

void throwRemovedWrongList() {
  kj::throwFatalException(KJ_EXCEPTION(FAILED,
      "tried to remove element from kj::List but the element is in a different list"));
}